

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

BOOL __thiscall
Js::JavascriptArray::SetProperty
          (JavascriptArray *this,JavascriptString *propertyNameString,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  code *pcVar1;
  bool bVar2;
  charcount_t length;
  BOOL BVar3;
  char16 *str;
  undefined4 *puVar4;
  JavascriptCopyOnAccessNativeIntArray *this_00;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  
  propertyRecord = (PropertyRecord *)info;
  str = JavascriptString::GetString(propertyNameString);
  length = JavascriptString::GetLength(propertyNameString);
  bVar2 = PropertyRecord::IsPropertyNameNumeric(str,length);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x327a,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord*"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar2 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(this);
  if (bVar2) {
    this_00 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(this);
    if (this_00 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_00);
    }
  }
  ScriptContext::FindPropertyRecord
            ((((((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
               javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
             propertyNameString,&local_40);
  if ((local_40 == (PropertyRecord *)0x0) || (local_40->pid != 0xd1)) {
    BVar3 = DynamicObject::SetProperty
                      ((DynamicObject *)this,propertyNameString,value,flags,
                       (PropertyValueInfo *)propertyRecord);
  }
  else {
    SetLength(this,value);
    BVar3 = 1;
  }
  return BVar3;
}

Assistant:

BOOL JavascriptArray::SetProperty(JavascriptString* propertyNameString, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord*");

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(this);
#endif
        PropertyRecord const* propertyRecord;
        this->GetScriptContext()->FindPropertyRecord(propertyNameString, &propertyRecord);

        if (propertyRecord != nullptr && propertyRecord->GetPropertyId() == PropertyIds::length)
        {
            return this->SetLength(value);
        }

        return DynamicObject::SetProperty(propertyNameString, value, flags, info);
    }